

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsItem::sceneBoundingRect(QGraphicsItem *this)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItem *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal dx;
  qreal dy;
  QGraphicsItemPrivate *itemd;
  QGraphicsItem *parentItem;
  QRectF br;
  QPointF offset;
  QPointF *in_stack_ffffffffffffff88;
  QGraphicsItemPrivate *in_stack_ffffffffffffff90;
  QGraphicsItem *local_48;
  QRectF local_38;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.xp = -NAN;
  local_18.yp = -NAN;
  QPointF::QPointF(&local_18);
  local_48 = in_RSI;
  do {
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             data(&local_48->d_ptr);
    if (pQVar2->transformData != (TransformData *)0x0) break;
    QPointF::operator+=(&local_18,&pQVar2->pos);
    local_48 = pQVar2->parent;
  } while (local_48 != (QGraphicsItem *)0x0);
  local_38.xp = -NAN;
  local_38.yp = -NAN;
  local_38.w = -NAN;
  local_38.h = -NAN;
  (*in_RSI->_vptr_QGraphicsItem[3])(&local_38);
  QRectF::translate((QRectF *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (local_48 == (QGraphicsItem *)0x0) {
    in_RDI->xp = local_38.xp;
    in_RDI->yp = local_38.yp;
    in_RDI->w = local_38.w;
    in_RDI->h = local_38.h;
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              (&local_48->d_ptr);
    bVar1 = QGraphicsItemPrivate::hasTranslateOnlySceneTransform(in_stack_ffffffffffffff90);
    if (bVar1) {
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&local_48->d_ptr);
      dx = QTransform::dx(&pQVar2->sceneTransform);
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&local_48->d_ptr);
      dy = QTransform::dy(&pQVar2->sceneTransform);
      QRectF::translate(&local_38,dx,dy);
      in_RDI->xp = local_38.xp;
      in_RDI->yp = local_38.yp;
      in_RDI->w = local_38.w;
      in_RDI->h = local_38.h;
    }
    else {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&local_48->d_ptr);
      QTransform::mapRect((QRectF *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QRectF QGraphicsItem::sceneBoundingRect() const
{
    // Find translate-only offset
    // COMBINE
    QPointF offset;
    const QGraphicsItem *parentItem = this;
    const QGraphicsItemPrivate *itemd;
    do {
        itemd = parentItem->d_ptr.data();
        if (itemd->transformData)
            break;
        offset += itemd->pos;
    } while ((parentItem = itemd->parent));

    QRectF br = boundingRect();
    br.translate(offset);
    if (!parentItem)
        return br;
    if (parentItem->d_ptr->hasTranslateOnlySceneTransform()) {
        br.translate(parentItem->d_ptr->sceneTransform.dx(), parentItem->d_ptr->sceneTransform.dy());
        return br;
    }
    return parentItem->d_ptr->sceneTransform.mapRect(br);
}